

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

bool __thiscall QMakeEvaluator::loadSpec(QMakeEvaluator *this)

{
  QString *fileName;
  QString *fileName_00;
  long lVar1;
  QMakeGlobals *this_00;
  ProFile *pPVar2;
  QMakeEvaluator *pQVar3;
  char16_t *pcVar4;
  Data *pDVar5;
  qsizetype qVar6;
  bool bVar7;
  VisitReturn VVar8;
  storage_type *psVar9;
  QList<ProString> *pQVar10;
  QString *pQVar11;
  char *str;
  QString *pQVar12;
  long lVar13;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QArrayDataPointer<QString> local_388 [2];
  QArrayDataPointer<ProString> local_358;
  QArrayDataPointer<char16_t> local_338;
  undefined1 local_318 [16];
  QArrayDataPointer<char16_t> *local_308;
  QMakeEvaluator evaluator;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_338.size = -0x5555555555555556;
  local_338.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_338.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  this_00 = this->m_option;
  pQVar11 = &this_00->xqmakespec;
  if (this->m_hostBuild != false) {
    pQVar11 = &this_00->qmakespec;
  }
  QMakeGlobals::expandEnvVars((QString *)&local_338,this_00,pQVar11);
  memset(&evaluator,0xaa,0x2b0);
  QMakeEvaluator(&evaluator,this->m_option,this->m_parser,this->m_vfs,this->m_handler);
  QString::operator=(&evaluator.m_sourceRoot,(QString *)&this->m_sourceRoot);
  QString::operator=(&evaluator.m_buildRoot,(QString *)&this->m_buildRoot);
  pQVar11 = &this->m_superfile;
  if ((this->m_superfile).d.size == 0) {
LAB_001fa75f:
    fileName = &this->m_conffile;
    if ((this->m_conffile).d.size != 0) {
      VVar8 = evaluateFile(&evaluator,fileName,EvalConfigFile,(LoadFlags)0x20);
      if (VVar8 != ReturnTrue) goto LAB_001fab1a;
    }
    fileName_00 = &this->m_cachefile;
    if ((this->m_cachefile).d.size != 0) {
      VVar8 = evaluateFile(&evaluator,fileName_00,EvalConfigFile,(LoadFlags)0x20);
      if (VVar8 != ReturnTrue) goto LAB_001fab1a;
    }
    if (local_338.size == 0) {
      if (this->m_hostBuild == false) {
        ProKey::ProKey((ProKey *)local_388,"XQMAKESPEC");
        first((ProString *)local_318,&evaluator,(ProKey *)local_388);
        ProString::toQString((QString *)&local_358,(ProString *)local_318);
        qVar6 = local_338.size;
        pcVar4 = local_338.ptr;
        pDVar5 = local_338.d;
        local_338.d = (Data *)local_358.d;
        local_338.ptr = (char16_t *)local_358.ptr;
        local_358.d = (Data *)pDVar5;
        local_358.ptr = (ProString *)pcVar4;
        local_338.size = local_358.size;
        local_358.size = qVar6;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_358);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_318);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_388);
        if (local_338.size != 0) goto LAB_001fa8f6;
      }
      ProKey::ProKey((ProKey *)local_388,"QMAKESPEC");
      first((ProString *)local_318,&evaluator,(ProKey *)local_388);
      ProString::toQString((QString *)&local_358,(ProString *)local_318);
      qVar6 = local_338.size;
      pcVar4 = local_338.ptr;
      pDVar5 = local_338.d;
      local_338.d = (Data *)local_358.d;
      local_338.ptr = (char16_t *)local_358.ptr;
      local_358.d = (Data *)pDVar5;
      local_358.ptr = (ProString *)pcVar4;
      local_338.size = local_358.size;
      local_358.size = qVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_358);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_318);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_388);
    }
LAB_001fa8f6:
    ProKey::ProKey((ProKey *)local_318,"QMAKEPATH");
    values((ProStringList *)&local_358,&evaluator,(ProKey *)local_318);
    ProStringList::toQStringList((QStringList *)local_388,(ProStringList *)&local_358);
    QArrayDataPointer<QString>::operator=(&(this->m_qmakepath).d,local_388);
    QArrayDataPointer<QString>::~QArrayDataPointer(local_388);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_358);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_318);
    ProKey::ProKey((ProKey *)local_318,"QMAKEFEATURES");
    values((ProStringList *)&local_358,&evaluator,(ProKey *)local_318);
    ProStringList::toQStringList((QStringList *)local_388,(ProStringList *)&local_358);
    QArrayDataPointer<QString>::operator=(&(this->m_qmakefeatures).d,local_388);
    QArrayDataPointer<QString>::~QArrayDataPointer(local_388);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_358);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_318);
    ~QMakeEvaluator(&evaluator);
    updateMkspecPaths(this);
    if (local_338.size == 0) {
      str = "QMAKE_XSPEC";
      if (this->m_hostBuild != false) {
        str = "QMAKE_SPEC";
      }
      ProKey::ProKey((ProKey *)local_318,str);
      propertyValue((ProString *)&evaluator,this,(ProKey *)local_318);
      ProString::toQString((QString *)local_388,(ProString *)&evaluator);
      qVar6 = local_338.size;
      pcVar4 = local_338.ptr;
      pDVar5 = local_338.d;
      local_338.d = (Data *)local_388[0].d;
      local_338.ptr = (char16_t *)local_388[0].ptr;
      local_388[0].d = (Data *)pDVar5;
      local_388[0].ptr = (QString *)pcVar4;
      local_338.size = local_388[0].size;
      local_388[0].size = qVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_388);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&evaluator);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_318);
    }
    bVar7 = QMakeInternal::IoUtils::isRelativePath((QString *)&local_338);
    if (bVar7) {
      pQVar12 = (this->m_mkspecPaths).d.ptr;
      for (lVar13 = (this->m_mkspecPaths).d.size * 0x18; lVar13 != 0; lVar13 = lVar13 + -0x18) {
        evaluator.m_current.pro = (ProFile *)0xaaaaaaaaaaaaaaaa;
        evaluator.m_caller = (QMakeEvaluator *)0xaaaaaaaaaaaaaaaa;
        evaluator.m_debugLevel = -0x55555556;
        evaluator._12_4_ = 0xaaaaaaaa;
        local_318[8] = '/';
        local_318._0_8_ = pQVar12;
        local_308 = &local_338;
        QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_QString_&>::convertTo<QString>
                  ((QString *)&evaluator,
                   (QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_QString_&> *)
                   local_318);
        bVar7 = QMakeInternal::IoUtils::exists((QString *)&evaluator);
        if (bVar7) {
          QString::operator=((QString *)&local_338,(QString *)&evaluator);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&evaluator)
          ;
          goto LAB_001fabe8;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&evaluator);
        pQVar12 = pQVar12 + 1;
      }
      psVar9 = (storage_type *)
               QByteArrayView::lengthHelperCharArray("Could not find qmake spec \'%1\'.",0x20);
      QVar14.m_data = psVar9;
      QVar14.m_size = (qsizetype)local_318;
      QString::fromLatin1(QVar14);
      bVar7 = false;
      QString::arg<QString,_true>
                ((QString *)&evaluator,(QString *)local_318,(QString *)&local_338,0,(QChar)0x20);
      evalError(this,(QString *)&evaluator);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&evaluator);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_318);
      goto LAB_001fab29;
    }
LAB_001fabe8:
    QDir::cleanPath((QString *)&evaluator);
    pQVar3 = (QMakeEvaluator *)(this->m_qmakespec).d.d;
    pcVar4 = (this->m_qmakespec).d.ptr;
    (this->m_qmakespec).d.d = (Data *)evaluator.m_caller;
    (this->m_qmakespec).d.ptr = (char16_t *)evaluator._8_8_;
    pPVar2 = (ProFile *)(this->m_qmakespec).d.size;
    (this->m_qmakespec).d.size = (qsizetype)evaluator.m_current.pro;
    evaluator.m_caller = pQVar3;
    evaluator._8_8_ = pcVar4;
    evaluator.m_current.pro = pPVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&evaluator);
    if ((this->m_superfile).d.size != 0) {
      ProKey::ProKey((ProKey *)&evaluator,"_QMAKE_SUPER_CACHE_");
      pQVar10 = &valuesRef(this,(ProKey *)&evaluator)->super_QList<ProString>;
      ProString::ProString((ProString *)local_318,pQVar11);
      QList<ProString>::emplaceBack<ProString_const&>(pQVar10,(ProString *)local_318);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_318);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&evaluator);
      VVar8 = evaluateFile(this,pQVar11,EvalConfigFile,(LoadFlags)0x20);
      if (VVar8 != ReturnTrue) goto LAB_001fab27;
    }
    bVar7 = loadSpecInternal(this);
    if (bVar7) {
      if ((this->m_conffile).d.size != 0) {
        ProKey::ProKey((ProKey *)&evaluator,"_QMAKE_CONF_");
        pQVar10 = &valuesRef(this,(ProKey *)&evaluator)->super_QList<ProString>;
        ProString::ProString((ProString *)local_318,fileName);
        QList<ProString>::emplaceBack<ProString_const&>(pQVar10,(ProString *)local_318);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_318);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&evaluator);
        bVar7 = false;
        VVar8 = evaluateFile(this,fileName,EvalConfigFile,(LoadFlags)0x0);
        if (VVar8 != ReturnTrue) goto LAB_001fab29;
      }
      if ((this->m_cachefile).d.size != 0) {
        ProKey::ProKey((ProKey *)&evaluator,"_QMAKE_CACHE_");
        pQVar10 = &valuesRef(this,(ProKey *)&evaluator)->super_QList<ProString>;
        ProString::ProString((ProString *)local_318,fileName_00);
        QList<ProString>::emplaceBack<ProString_const&>(pQVar10,(ProString *)local_318);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_318);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&evaluator);
        bVar7 = false;
        VVar8 = evaluateFile(this,fileName_00,EvalConfigFile,(LoadFlags)0x0);
        if (VVar8 != ReturnTrue) goto LAB_001fab29;
      }
      if ((this->m_stashfile).d.size != 0) {
        pQVar11 = &this->m_stashfile;
        bVar7 = QMakeVfs::exists(this->m_vfs,pQVar11,(VfsFlags)0x0);
        if (bVar7) {
          ProKey::ProKey((ProKey *)&evaluator,"_QMAKE_STASH_");
          pQVar10 = &valuesRef(this,(ProKey *)&evaluator)->super_QList<ProString>;
          ProString::ProString((ProString *)local_318,pQVar11);
          QList<ProString>::emplaceBack<ProString_const&>(pQVar10,(ProString *)local_318);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_318);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&evaluator)
          ;
          bVar7 = false;
          VVar8 = evaluateFile(this,pQVar11,EvalConfigFile,(LoadFlags)0x0);
          if (VVar8 != ReturnTrue) goto LAB_001fab29;
        }
      }
      bVar7 = true;
      goto LAB_001fab29;
    }
  }
  else {
    VVar8 = evaluateFile(&evaluator,pQVar11,EvalConfigFile,(LoadFlags)0x20);
    if (VVar8 == ReturnTrue) goto LAB_001fa75f;
LAB_001fab1a:
    ~QMakeEvaluator(&evaluator);
  }
LAB_001fab27:
  bVar7 = false;
LAB_001fab29:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_338);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeEvaluator::loadSpec()
{
    QString qmakespec = m_option->expandEnvVars(
                m_hostBuild ? m_option->qmakespec : m_option->xqmakespec);

    {
        QMakeEvaluator evaluator(m_option, m_parser, m_vfs, m_handler);
        evaluator.m_sourceRoot = m_sourceRoot;
        evaluator.m_buildRoot = m_buildRoot;

        if (!m_superfile.isEmpty() && evaluator.evaluateFile(
                m_superfile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue) {
            return false;
        }
        if (!m_conffile.isEmpty() && evaluator.evaluateFile(
                m_conffile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue) {
            return false;
        }
        if (!m_cachefile.isEmpty() && evaluator.evaluateFile(
                m_cachefile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue) {
            return false;
        }
        if (qmakespec.isEmpty()) {
            if (!m_hostBuild)
                qmakespec = evaluator.first(ProKey("XQMAKESPEC")).toQString();
            if (qmakespec.isEmpty())
                qmakespec = evaluator.first(ProKey("QMAKESPEC")).toQString();
        }
        m_qmakepath = evaluator.values(ProKey("QMAKEPATH")).toQStringList();
        m_qmakefeatures = evaluator.values(ProKey("QMAKEFEATURES")).toQStringList();
    }

    updateMkspecPaths();
    if (qmakespec.isEmpty())
        qmakespec = propertyValue(ProKey(m_hostBuild ? "QMAKE_SPEC" : "QMAKE_XSPEC")).toQString();
#ifndef QT_BUILD_QMAKE
    // Legacy support for Qt4 qmake in Qt Creator, etc.
    if (qmakespec.isEmpty())
        qmakespec = m_hostBuild ? QLatin1String("default-host") : QLatin1String("default");
#endif
    if (IoUtils::isRelativePath(qmakespec)) {
        for (const QString &root : std::as_const(m_mkspecPaths)) {
            QString mkspec = root + QLatin1Char('/') + qmakespec;
            if (IoUtils::exists(mkspec)) {
                qmakespec = mkspec;
                goto cool;
            }
        }
        evalError(fL1S("Could not find qmake spec '%1'.").arg(qmakespec));
        return false;
    }
  cool:
    m_qmakespec = QDir::cleanPath(qmakespec);

    if (!m_superfile.isEmpty()) {
        valuesRef(ProKey("_QMAKE_SUPER_CACHE_")) << ProString(m_superfile);
        if (evaluateFile(
                m_superfile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue)
            return false;
    }
    if (!loadSpecInternal())
        return false;
    if (!m_conffile.isEmpty()) {
        valuesRef(ProKey("_QMAKE_CONF_")) << ProString(m_conffile);
        if (evaluateFile(
                m_conffile, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue)
            return false;
    }
    if (!m_cachefile.isEmpty()) {
        valuesRef(ProKey("_QMAKE_CACHE_")) << ProString(m_cachefile);
        if (evaluateFile(
                m_cachefile, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue)
            return false;
    }
    QMakeVfs::VfsFlags flags = (m_cumulative ? QMakeVfs::VfsCumulative : QMakeVfs::VfsExact);
    if (!m_stashfile.isEmpty() && m_vfs->exists(m_stashfile, flags)) {
        valuesRef(ProKey("_QMAKE_STASH_")) << ProString(m_stashfile);
        if (evaluateFile(
                m_stashfile, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue)
            return false;
    }
    return true;
}